

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

bool __thiscall
r_exec::CTPX::build_requirement(CTPX *this,HLPBindingMap *bm,Code *m0,uint64_t period)

{
  atomic_int_fast64_t *paVar1;
  P<r_exec::Fact> object;
  short sVar2;
  int iVar3;
  _Fact *this_00;
  uint64_t uVar4;
  undefined4 extraout_var;
  long *plVar5;
  Code *pCVar6;
  undefined4 extraout_var_00;
  _TPX *this_01;
  _Object *this_02;
  ModelBase *this_03;
  bool bVar7;
  _TPX *this_04;
  uint16_t write_index;
  P<r_code::Code> m1;
  uint16_t premise_index;
  P<r_code::Code> local_68;
  P<r_exec::Fact> f_im0;
  P<r_exec::GuardBuilder> guard_builder;
  P<r_exec::HLPBindingMap> _bm;
  Code *new_cst;
  Code *_m1;
  Code *_m0;
  
  this_00 = _TPX::find_f_icst(&this->super__TPX,(_Fact *)(this->super__TPX).super_TPX.target.object,
                              &premise_index,&new_cst);
  if (this_00 == (_Fact *)0x0) {
    return false;
  }
  f_im0.object = (_Object *)HLPBindingMap::build_f_ihlp(bm,m0,Opcodes::IMdl,false);
  pCVar6 = (Code *)0x0;
  if ((Code *)f_im0.object != (Code *)0x0) {
    LOCK();
    paVar1 = &(((_Fact *)&((Code *)f_im0.object)->super__Object)->super_LObject).
              super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.super__Object.
              refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    pCVar6 = (Code *)f_im0.object;
  }
  uVar4 = _Fact::get_after(this_00);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>(pCVar6,2,uVar4);
  object = f_im0;
  uVar4 = _Fact::get_before(this_00);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>((Code *)object.object,3,uVar4);
  pCVar6 = new_cst;
  if (new_cst == (Code *)0x0) {
    iVar3 = (*(this_00->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this_00,0);
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
                               ((long *)CONCAT44(extraout_var,iVar3),0);
    sVar2 = (**(code **)(*plVar5 + 0x50))(plVar5);
    pCVar6 = (Code *)(**(code **)(*plVar5 + 0x48))(plVar5,sVar2 + -1);
  }
  iVar3 = (*(pCVar6->super__Object)._vptr__Object[9])(pCVar6,(ulong)premise_index);
  this_01 = (_TPX *)operator_new(0x40);
  this_04 = this_01;
  HLPBindingMap::HLPBindingMap((HLPBindingMap *)this_01);
  LOCK();
  paVar1 = &(this_01->super_TPX).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  _bm.object = (_Object *)this_01;
  m1.object = &_TPX::build_mdl_head
                         (this_04,(HLPBindingMap *)this_01,0,this_00,f_im0.object,&write_index)->
               super__Object;
  if ((Code *)m1.object != (Code *)0x0) {
    LOCK();
    paVar1 = &((_Object *)&(m1.object)->_vptr__Object)->refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  this_02 = (_Object *)operator_new(0x10);
  GuardBuilder::GuardBuilder((GuardBuilder *)this_02);
  LOCK();
  (this_02->refCount).super___atomic_base<long>._M_i =
       (this_02->refCount).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  guard_builder.object = this_02;
  (*((_Object *)&this_02->_vptr__Object)->_vptr__Object[2])
            (this_02,m1.object,CONCAT44(extraout_var_00,iVar3),0,&write_index);
  _TPX::build_mdl_tail(&this->super__TPX,(Code *)m1.object,write_index);
  this_03 = ModelBase::Get();
  ModelBase::check_existence(this_03,m0,(Code *)m1.object,&_m0,&_m1);
  if (_m1 != (Code *)0x0) {
    bVar7 = true;
    if (_m1 != (Code *)m1.object) goto LAB_001a2b2b;
    if (_m0 != (Code *)0x0) {
      if (_m0 == m0) {
        LOCK();
        paVar1 = &(m0->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        local_68.object = &m0->super__Object;
        std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
        emplace_back<core::P<r_code::Code>>
                  ((vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)
                   &(this->super__TPX).mdls,&local_68);
        core::P<r_code::Code>::~P(&local_68);
      }
      if (new_cst != (Code *)0x0) {
        local_68.object = &new_cst->super__Object;
        LOCK();
        paVar1 = &(new_cst->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
        emplace_back<core::P<r_code::Code>>
                  ((vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)
                   &(this->super__TPX).csts,&local_68);
        core::P<r_code::Code>::~P(&local_68);
      }
      std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                (&(this->super__TPX).mdls,&m1);
      goto LAB_001a2b2b;
    }
  }
  bVar7 = false;
LAB_001a2b2b:
  core::P<r_exec::GuardBuilder>::~P(&guard_builder);
  core::P<r_code::Code>::~P(&m1);
  core::P<r_exec::HLPBindingMap>::~P(&_bm);
  core::P<r_exec::Fact>::~P(&f_im0);
  return bVar7;
}

Assistant:

bool CTPX::build_requirement(HLPBindingMap *bm, Code *m0, uint64_t period)   // check for mdl existence at the same time (ModelBase::mdlCS-wise).
{
    uint16_t premise_index;
    Code *new_cst;
    _Fact *f_icst = find_f_icst(target, premise_index, new_cst);

    if (f_icst == nullptr) { //std::cout<<Utils::RelativeTime(Now())<<" failed xxxxxxxxx M1 / 0\n";
        return false;
    }

    P<Fact> f_im0 = bm->build_f_ihlp(m0, Opcodes::IMdl, false);
    Utils::SetIndirectTimestamp<Code>(f_im0, FACT_AFTER, f_icst->get_after());
    Utils::SetIndirectTimestamp<Code>(f_im0, FACT_BEFORE, f_icst->get_before());
    Code *unpacked_cst;

    if (new_cst == nullptr) {
        Code *cst = f_icst->get_reference(0)->get_reference(0);
        unpacked_cst = cst->get_reference(cst->references_size() - CST_HIDDEN_REFS); // the cst is packed, retrieve the pattern from the unpacked code.
    } else {
        unpacked_cst = new_cst;
    }

    _Fact *premise_pattern = (_Fact *)unpacked_cst->get_reference(premise_index);
    P<HLPBindingMap> _bm = new HLPBindingMap();
    uint16_t write_index;
    P<Code> m1 = build_mdl_head(_bm, 0, f_icst, f_im0, write_index);
    P<GuardBuilder> guard_builder = new GuardBuilder();
    guard_builder->build(m1, premise_pattern, nullptr, write_index);
    build_mdl_tail(m1, write_index);
    Code *_m0;
    Code *_m1;
    ModelBase::Get()->check_existence(m0, m1, _m0, _m1);

    if (_m1 == nullptr) {
        return false;
    } else if (_m1 == m1) {
        if (_m0 == nullptr) {
            return false;
        } else if (_m0 == m0) {
            mdls.push_back(m0);
        }

        if (new_cst != nullptr) {
            csts.push_back(new_cst);
        }

        mdls.push_back(m1);
    } // if m1 alrady exists, new_cst==NULL.

    //std::cout<<Utils::RelativeTime(Now()<<" found --------------------- M1\n";
    return true;
}